

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Osc::renderNoise(V2Osc *this,float *dest,int nsamples)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar2 = this->nseed;
  if (0 < nsamples) {
    fVar5 = (this->nf).b;
    fVar4 = (this->nf).l;
    bVar1 = this->ring;
    uVar3 = 0;
    do {
      uVar2 = uVar2 * 0xbb38435 + 0x3619636b;
      fVar4 = fVar4 + fVar5 * this->nfres;
      fVar6 = ((float)(uVar2 >> 9 | 0x40000000) + -3.0 + -fVar5 * (float)this->nseed) - fVar4;
      fVar5 = this->nfres * fVar6 + fVar5;
      fVar6 = ((float)this->nseed * (fVar6 + fVar4) + fVar5) * this->gain;
      if (bVar1 == false) {
        fVar6 = dest[uVar3] + fVar6;
      }
      else {
        fVar6 = dest[uVar3] * fVar6;
      }
      dest[uVar3] = fVar6;
      uVar3 = uVar3 + 1;
    } while ((uint)nsamples != uVar3);
  }
  this->nseed = uVar2;
  return;
}

Assistant:

void renderNoise(float *dest, int nsamples)
    {
        COVER("Osc noise");

        V2LRC flt = nf;
        uint32_t seed = nseed;

        for (int i=0; i < nsamples; i++)
        {
            // uniform random value (noise)
            float n = frandom(&seed);

            // filter
            float h = flt.step(n, nffrq, nfres);
            float x = nfres*(flt.l + h) + flt.b;

            output(dest + i, gain * x);
        }

        flt = nf;
        nseed = seed;
    }